

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::SyncToCharAndBackupInst::Exec
          (SyncToCharAndBackupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  uint uVar3;
  Type pRVar4;
  CharCount CVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar3 = (this->super_BackupMixin).backup.lower;
  CVar5 = *matchStart;
  if (uVar3 <= inputLength - CVar5) {
    uVar7 = *inputOffset;
    if (uVar7 < *nextSyncInputOffset) {
LAB_00d4cf8f:
      *instPointer = *instPointer + 0xb;
      return false;
    }
    if (uVar7 - CVar5 < uVar3) {
      uVar7 = CVar5 + uVar3;
      *inputOffset = uVar7;
    }
    CVar2 = (this->super_CharMixin).c;
    pRVar4 = matcher->stats;
    uVar6 = (ulong)uVar7;
    while (uVar6 < inputLength) {
      if (input[uVar6] == CVar2) {
        *nextSyncInputOffset = (int)uVar6 + 1;
        uVar3 = (this->super_BackupMixin).backup.upper;
        CVar5 = *matchStart;
        if (uVar3 != 0xffffffff) {
          uVar7 = *inputOffset - CVar5;
          if (uVar3 <= uVar7) {
            uVar7 = uVar3;
          }
          CVar5 = *inputOffset - uVar7;
          *matchStart = CVar5;
        }
        *inputOffset = CVar5;
        goto LAB_00d4cf8f;
      }
      if (pRVar4 != (Type)0x0) {
        puVar1 = &pRVar4->numCompares;
        *puVar1 = *puVar1 + 1;
      }
      uVar6 = uVar6 + 1;
      *inputOffset = (CharCount)uVar6;
    }
  }
  *matchStart = inputLength;
  return true;
}

Assistant:

inline bool SyncToCharAndBackupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        const Char matchC = c;
        while (inputOffset < inputLength && input[inputOffset] != matchC)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset >= inputLength)
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Backup at most by backup.upper for new start
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }